

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O3

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::display_tikz
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          Dict *sd,Dict *td)

{
  uint *puVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  Tensor *pTVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  undefined1 auVar15 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar17 [16];
  int local_88;
  uint local_68 [2];
  Tensor *local_60;
  uint local_58;
  Dim local_54;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qb;
  
  local_58 = (alignment->i).t;
  uVar5 = (ulong)((long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar12 = (ulong)((long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  pTVar6 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)cg);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," x ",3);
  local_60 = pTVar6;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  auVar17 = std::ostream::flush();
  auVar16._0_8_ = auVar17._8_8_;
  auVar15._0_8_ = auVar17._0_8_;
  auVar16._8_8_ = extraout_XMM1_Qb;
  auVar15._8_56_ = extraout_var;
  auVar17 = auVar15._0_16_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\\begin{tikzpicture}[scale=0.5]\n",0x1f);
  uVar10 = (uint)uVar12;
  local_88 = (int)uVar5;
  if (uVar10 != 0) {
    auVar17 = vcvtusi2sd_avx512f(auVar17,local_88);
    uVar13 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\\node[anchor=west,rotate=90] at (",0x21);
      auVar3 = vcvtusi2sd_avx512f(auVar16,(int)uVar13);
      poVar7 = std::ostream::_M_insert<double>(auVar3._0_8_ + 0.5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = std::ostream::_M_insert<double>(auVar17._0_8_ + 0.2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") { ",4);
      pbVar2 = (sd->words_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      if ((int)((ulong)((long)(sd->words_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5) <=
          iVar11) goto LAB_0013a359;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,pbVar2[iVar11]._M_dataplus._M_p,pbVar2[iVar11]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," };\n",4);
      uVar13 = uVar13 + 1;
    } while ((uVar12 & 0xffffffff) != uVar13);
  }
  if (local_88 != 0) {
    auVar17 = vcvtusi2sd_avx512f(auVar16,uVar10);
    uVar13 = 0;
    uVar12 = uVar5 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\\node[anchor=west] at (",0x17);
      poVar7 = std::ostream::_M_insert<double>(auVar17._0_8_ + 0.2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      auVar3 = vcvtusi2sd_avx512f(auVar16,(int)uVar12);
      poVar7 = std::ostream::_M_insert<double>(auVar3._0_8_ + -0.5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") { ",4);
      pbVar2 = (td->words_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      if ((int)((ulong)((long)(td->words_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5) <=
          iVar11) {
LAB_0013a359:
        __assert_fail("id < (int)words_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/dict.h"
                      ,0x33,"const std::string &dynet::Dict::convert(const int &) const");
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,pbVar2[iVar11]._M_dataplus._M_p,pbVar2[iVar11]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," };\n",4);
      uVar13 = uVar13 + 1;
      uVar12 = (ulong)((int)uVar12 - 1);
    } while ((uVar5 & 0xffffffff) != uVar13);
    if (local_88 != 0) {
      iVar11 = 0;
      do {
        if (uVar10 != 0) {
          uVar9 = 0;
          auVar17 = vcvtusi2ss_avx512f(auVar16,(local_88 - iVar11) + -1);
          auVar3 = vcvtusi2ss_avx512f(auVar16,local_88 - iVar11);
          do {
            local_68[0] = uVar9;
            local_68[1] = iVar11;
            local_54.nd = 0;
            local_54.bd = 1;
            lVar8 = 0;
            do {
              uVar5 = local_54._28_8_ & 0xffffffff;
              puVar1 = (uint *)((long)local_68 + lVar8);
              lVar8 = lVar8 + 4;
              local_54.nd = local_54.nd + 1;
              local_54.d[uVar5] = *puVar1;
            } while (lVar8 != 8);
            fVar14 = (float)dynet::TensorTools::AccessElement(local_60,&local_54);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\\fill[blue!",0xb);
            poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)(fVar14 * 100.0));
            auVar16._8_8_ = extraout_XMM1_Qb_00;
            auVar16._0_8_ = extraout_XMM1_Qa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"!black] (",9);
            auVar4 = vcvtusi2ss_avx512f(auVar16,uVar9);
            poVar7 = std::ostream::_M_insert<double>((double)(auVar4._0_4_ + 0.01));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)(auVar17._0_4_ + 0.01));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,") rectangle (",0xd);
            uVar9 = uVar9 + 1;
            auVar4 = vcvtusi2ss_avx512f(auVar16,uVar9);
            poVar7 = std::ostream::_M_insert<double>((double)(auVar4._0_4_ + -0.01));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
            poVar7 = std::ostream::_M_insert<double>((double)(auVar3._0_4_ + -0.01));
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n",3);
          } while (uVar9 != uVar10);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != local_88);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\\draw[step=1cm,color=gray] (0,0) grid (",0x27);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\\end{tikzpicture}\n",0x12);
  return;
}

Assistant:

void 
AttentionalModel<Builder>::display_tikz(const std::vector<int> &source, const std::vector<int>& target, 
                          ComputationGraph &cg, const Expression &alignment, Dict &sd, Dict &td)
{
    using namespace std;

    // display the alignment
    unsigned I = target.size();
    unsigned J = source.size();

    const Tensor &a = cg.get_value(alignment.i);
    cout << a.d[0] << " x " << a.d[1] << endl;

    cout << "\\begin{tikzpicture}[scale=0.5]\n";
    for (unsigned j = 0; j < J; ++j) 
        cout << "\\node[anchor=west,rotate=90] at (" << j+0.5 << ", " << I+0.2 << ") { " << sd.convert(source[j]) << " };\n";
    for (unsigned i = 0; i < I; ++i) 
        cout << "\\node[anchor=west] at (" << J+0.2 << ", " << I-i-0.5 << ") { " << td.convert(target[i]) << " };\n";

    float eps = 0.01;
    for (unsigned i = 0; i < I; ++i) {
        for (unsigned j = 0; j < J; ++j) {
            float v = TensorTools::AccessElement(a, Dim({(unsigned int)j, (unsigned int)i}));
            //int val = int(pow(v, 0.5) * 100);
            int val = int(v * 100);
            cout << "\\fill[blue!" << val << "!black] (" << j+eps << ", " << I-i-1+eps << ") rectangle (" << j+1-eps << "," << I-i-eps << ");\n";
        }
    }
    cout << "\\draw[step=1cm,color=gray] (0,0) grid (" << J << ", " << I << ");\n";
    cout << "\\end{tikzpicture}\n";
}